

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O2

int generator_segment_mix(mixed_segment *segment)

{
  float fVar1;
  undefined8 *puVar2;
  ulong uVar3;
  code *pcVar4;
  uint32_t i;
  ulong uVar5;
  float fVar6;
  double dVar7;
  uint32_t samples;
  double local_38;
  float *out;
  
  puVar2 = (undefined8 *)segment->data;
  if (*(int *)(puVar2 + 1) - 1U < 4) {
    pcVar4 = (code *)(&PTR_sine_wave_002b6970)[*(int *)(puVar2 + 1) - 1U];
  }
  else {
    pcVar4 = (code *)0x0;
  }
  local_38 = (double)puVar2[2];
  fVar1 = *(float *)((long)puVar2 + 0x1c);
  samples = 0xffffffff;
  mixed_buffer_request_write(&out,&samples,(mixed_buffer *)*puVar2);
  uVar5 = 0;
  dVar7 = local_38;
  while( true ) {
    uVar3 = (long)dVar7 & 0xffffffff;
    if (samples <= uVar5) break;
    fVar6 = (float)(*pcVar4)(*(undefined4 *)((long)puVar2 + 0xc),(double)uVar3,
                             (float)*(uint *)(puVar2 + 3));
    out[uVar5] = fVar6 * fVar1;
    dVar7 = fmod((double)((int)(long)dVar7 + 1),(double)*(uint *)(puVar2 + 3));
    uVar5 = uVar5 + 1;
  }
  mixed_buffer_finish_write(samples,(mixed_buffer *)*puVar2);
  puVar2[2] = (double)uVar3;
  return 1;
}

Assistant:

int generator_segment_mix(struct mixed_segment *segment){
  struct generator_segment_data *data = (struct generator_segment_data *)segment->data;
  uint32_t phase = data->phase;
  float (*generator)(float frequency, double phase, float samplerate) = 0;
  float volume = data->volume;

  switch(data->type){
  case MIXED_SINE: generator = sine_wave; break;
  case MIXED_SQUARE: generator = square_wave; break;
  case MIXED_TRIANGLE: generator = triangle_wave; break;
  case MIXED_SAWTOOTH: generator = sawtooth_wave; break;
  }
  
  float *restrict out;
  uint32_t samples = UINT32_MAX;
  mixed_buffer_request_write(&out, &samples, data->out);
  for(uint32_t i=0; i<samples; ++i){
    out[i] = generator(data->frequency, phase, data->samplerate) * volume;
    phase = fmod(phase+1, data->samplerate);
  }
  mixed_buffer_finish_write(samples, data->out);

  data->phase = phase;
  return 1;
}